

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAig.c
# Opt level: O0

int Gia_ManSolveSat(Gia_Man_t *p)

{
  void *pvVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  Aig_Man_t *pMan;
  Gia_Obj_t *pGVar8;
  bool bVar9;
  int *pInit;
  Gia_Obj_t *pGStack_28;
  int i;
  Gia_Obj_t *pObj;
  int RetValue;
  Aig_Man_t *pNew;
  Gia_Man_t *p_local;
  
  pMan = Gia_ManToAig(p,0);
  iVar4 = Fra_FraigSat(pMan,10000000,0,0,0,0,1,1,0,0);
  if (iVar4 == 0) {
    pvVar1 = pMan->pData;
    pGVar8 = Gia_ManConst0(p);
    *(ulong *)pGVar8 = *(ulong *)pGVar8 & 0xffffffffbfffffff;
    pInit._4_4_ = 0;
    while( true ) {
      iVar5 = Gia_ManPiNum(p);
      bVar9 = false;
      if (pInit._4_4_ < iVar5) {
        pGStack_28 = Gia_ManCi(p,pInit._4_4_);
        bVar9 = pGStack_28 != (Gia_Obj_t *)0x0;
      }
      if (!bVar9) break;
      *(ulong *)pGStack_28 =
           *(ulong *)pGStack_28 & 0xffffffffbfffffff |
           ((ulong)*(uint *)((long)pvVar1 + (long)pInit._4_4_ * 4) & 1) << 0x1e;
      pInit._4_4_ = pInit._4_4_ + 1;
    }
    pInit._4_4_ = 0;
    while( true ) {
      bVar9 = false;
      if (pInit._4_4_ < p->nObjs) {
        pGStack_28 = Gia_ManObj(p,pInit._4_4_);
        bVar9 = pGStack_28 != (Gia_Obj_t *)0x0;
      }
      if (!bVar9) break;
      iVar5 = Gia_ObjIsAnd(pGStack_28);
      if (iVar5 != 0) {
        pGVar8 = Gia_ObjFanin0(pGStack_28);
        uVar3 = *(ulong *)pGVar8;
        uVar7 = Gia_ObjFaninC0(pGStack_28);
        pGVar8 = Gia_ObjFanin1(pGStack_28);
        uVar2 = *(ulong *)pGVar8;
        uVar6 = Gia_ObjFaninC1(pGStack_28);
        *(ulong *)pGStack_28 =
             *(ulong *)pGStack_28 & 0xffffffffbfffffff |
             ((ulong)(((uint)(uVar3 >> 0x1e) & 1 ^ uVar7) & ((uint)(uVar2 >> 0x1e) & 1 ^ uVar6)) & 1
             ) << 0x1e;
      }
      pInit._4_4_ = pInit._4_4_ + 1;
    }
    pInit._4_4_ = 0;
    while( true ) {
      iVar5 = Gia_ManPoNum(p);
      bVar9 = false;
      if (pInit._4_4_ < iVar5) {
        pGStack_28 = Gia_ManCo(p,pInit._4_4_);
        bVar9 = pGStack_28 != (Gia_Obj_t *)0x0;
      }
      if (!bVar9) break;
      pGVar8 = Gia_ObjFanin0(pGStack_28);
      uVar3 = *(ulong *)pGVar8;
      uVar7 = Gia_ObjFaninC0(pGStack_28);
      *(ulong *)pGStack_28 =
           *(ulong *)pGStack_28 & 0xffffffffbfffffff |
           ((ulong)((uint)(uVar3 >> 0x1e) & 1 ^ uVar7) & 1) << 0x1e;
      pInit._4_4_ = pInit._4_4_ + 1;
    }
    pInit._4_4_ = 0;
    while( true ) {
      iVar5 = Gia_ManPoNum(p);
      bVar9 = false;
      if (pInit._4_4_ < iVar5) {
        pGStack_28 = Gia_ManCo(p,pInit._4_4_);
        bVar9 = pGStack_28 != (Gia_Obj_t *)0x0;
      }
      if ((!bVar9) || (((uint)(*(ulong *)pGStack_28 >> 0x1e) & 1) != 1)) break;
      pInit._4_4_ = pInit._4_4_ + 1;
    }
    iVar5 = Gia_ManPoNum(p);
    if (pInit._4_4_ != iVar5) {
      Abc_Print(1,"Counter-example verification has failed.  ");
    }
  }
  Aig_ManStop(pMan);
  return iVar4;
}

Assistant:

int Gia_ManSolveSat( Gia_Man_t * p )
{
//    extern int Fra_FraigSat( Aig_Man_t * pMan, ABC_INT64_T nConfLimit, ABC_INT64_T nInsLimit, int fFlipBits, int fAndOuts, int fNewSolver, int fVerbose );
    Aig_Man_t * pNew;
    int RetValue;//, clk = Abc_Clock();
    pNew = Gia_ManToAig( p, 0 );
    RetValue = Fra_FraigSat( pNew, 10000000, 0, 0, 0, 0, 1, 1, 0, 0 );
    if ( RetValue == 0 )
    {
        Gia_Obj_t * pObj;
        int i, * pInit = (int *)pNew->pData;
        Gia_ManConst0(p)->fMark0 = 0;
        Gia_ManForEachPi( p, pObj, i )
            pObj->fMark0 = pInit[i];
        Gia_ManForEachAnd( p, pObj, i )
            pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) & 
                           (Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj));
        Gia_ManForEachPo( p, pObj, i )
            pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj));
        Gia_ManForEachPo( p, pObj, i )
            if ( pObj->fMark0 != 1 )
                break;
        if ( i != Gia_ManPoNum(p) )
            Abc_Print( 1, "Counter-example verification has failed.  " );
//        else
//            Abc_Print( 1, "Counter-example verification succeeded.  " );
    }
/*
    else if ( RetValue == 1 )
        Abc_Print( 1, "The SAT problem is unsatisfiable.  " );
    else if ( RetValue == -1 )
        Abc_Print( 1, "The SAT problem is undecided.  " );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
*/
    Aig_ManStop( pNew );
    return RetValue;
}